

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O3

void cpp_wrapper_insert(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int value,
                       ion_boolean_t check_result)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  ion_value_t ion_value;
  int local_38;
  int local_34;
  
  _local_38 = CONCAT44(key,value);
  iVar2 = dictionary_insert(&dict->dict,&local_34,&local_38);
  dict->last_status = iVar2;
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,0,(int)iVar2.error,0xf5,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_int_are_equal
                      (tc,1,iVar2.count,0xf6,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                      );
    if (pVar1 != '\0') {
      if (check_result != '\0') {
        cpp_wrapper_get(tc,dict,key,value,'\0',1);
      }
      return;
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_insert(
	planck_unit_test_t *tc,
	Dictionary<int, int>	*dict,
	int key,
	int value,
	ion_boolean_t check_result
) {
	ion_status_t status = dict->insert(key, value);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 1, status.count);

	if (check_result) {
		cpp_wrapper_get(tc, dict, key, value, err_ok, 1);
	}
}